

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::microfacet::vndf(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  undefined8 uVar1;
  float_t fVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar4;
  float fVar5;
  float fVar6;
  float __x;
  vec3 vVar7;
  undefined8 local_68;
  float local_60;
  undefined1 local_58 [16];
  vec3 local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  
  vVar7 = djb::operator*(&args->mtra,wm);
  fVar4 = vVar7.z;
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = vVar7._0_8_;
  local_58._12_4_ = extraout_XMM0_Dd;
  vVar7 = djb::operator*(&args->minv,wi);
  local_48.z = vVar7.z;
  local_48._0_8_ = vVar7._0_8_;
  vVar7 = normalize(&local_48);
  local_60 = vVar7.z;
  uVar1 = vVar7._0_8_;
  local_68._4_4_ = vVar7.y;
  local_68._0_4_ = vVar7.x;
  local_28 = local_60 * fVar4 +
             (float)local_68 * (float)local_58._0_4_ + local_68._4_4_ * (float)local_58._4_4_;
  fVar2 = 0.0;
  if (0.0 < local_28) {
    __x = fVar4 * fVar4 +
          (float)local_58._0_4_ * (float)local_58._0_4_ +
          (float)local_58._4_4_ * (float)local_58._4_4_;
    local_68 = uVar1;
    if (__x <= 0.0) {
      __assert_fail("x > T(0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                    ,0x259,"T djb::inversesqrt(const T &) [T = float]");
    }
    if (__x < 0.0) {
      local_38 = (float)local_58._4_4_;
      fStack_34 = (float)local_58._4_4_;
      fStack_30 = (float)local_58._4_4_;
      fStack_2c = (float)local_58._4_4_;
      fVar3 = sqrtf(__x);
      fVar5 = (float)local_58._0_4_;
      fVar6 = local_38;
    }
    else {
      fVar3 = SQRT(__x);
      fVar5 = (float)local_58._0_4_;
      fVar6 = (float)local_58._4_4_;
    }
    fVar3 = 1.0 / fVar3;
    local_58._0_4_ = args->detm / (__x * __x);
    local_48.z = fVar4 * fVar3;
    local_48.y = fVar6 * fVar3;
    local_48.x = fVar5 * fVar3;
    (*(this->super_brdf)._vptr_brdf[0xb])(this);
    (*(this->super_brdf)._vptr_brdf[10])(this,&local_68);
    fVar2 = (float_t)(-(uint)(0.0 < extraout_XMM0_Da) &
                     (uint)(((local_28 * extraout_XMM0_Da) / extraout_XMM0_Da_00) *
                           (float)local_58._0_4_));
  }
  return fVar2;
}

Assistant:

float_t
microfacet::vndf(const vec3 &wm, const vec3 &wi, const args &args) const
{
	vec3 wm_std = args.mtra * wm;
	vec3 wi_std = normalize(args.minv * wi);
	float_t dpd = dot(wm_std, wi_std);

	if (dpd > 0) {
		float_t nrmsqr = dot(wm_std, wm_std);
		float_t nrm = inversesqrt(nrmsqr);
		float_t dwdw = args.detm / sqr(nrmsqr);
		float_t D = ndf_std(wm_std * nrm);
		float_t sigma = sigma_std(wi_std);

		return D > 0 ? dpd * D / sigma * dwdw : 0;
	}

	return 0;
}